

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O1

bool __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
pop<depspawn::internal::TaskPool::Task*>
          (queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *this,
          Task **ret)

{
  atomic<boost::lockfree::detail::tagged_index> *paVar1;
  tagged_index tVar2;
  uint uVar3;
  tagged_index tVar4;
  node *pnVar5;
  byte in_CL;
  index_t iVar6;
  uint *puVar7;
  tagged_index tVar8;
  uint *puVar9;
  bool bVar10;
  
  do {
    tVar2 = (this->head_)._M_i;
    puVar7 = (uint *)0x0;
    iVar6 = tVar2.index;
    puVar9 = (uint *)((long)&(((this->pool).
                               super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                              .nodes_)->next)._M_i.index + (ulong)(((uint)tVar2 & 0xffff) << 6));
    if (iVar6 == (index_t)(this->pool).
                          super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                          .node_count_) {
      puVar9 = puVar7;
    }
    tVar8 = (this->tail_)._M_i;
    uVar3 = *puVar9;
    puVar9 = (uint *)((long)&(((this->pool).
                               super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                              .nodes_)->next)._M_i.index + (ulong)((uVar3 & 0xffff) << 6));
    if ((short)uVar3 ==
        (short)(this->pool).
               super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
               .node_count_) {
      puVar9 = puVar7;
    }
    tVar4 = (this->head_)._M_i;
    if ((iVar6 == tVar4.index) && (((uint)tVar4 ^ (uint)tVar2) < 0x10000)) {
      if (iVar6 == tVar8.index) {
        if (puVar9 == (uint *)0x0) {
          puVar7 = (uint *)0x1;
          in_CL = 0;
        }
        else {
          LOCK();
          if (tVar8 == (this->tail_)._M_i) {
            (this->tail_)._M_i =
                 (tagged_index)(((uint)tVar8 & 0xffff0000) + (uVar3 & 0xffff) + 0x10000);
          }
          UNLOCK();
LAB_001094d0:
          puVar7 = (uint *)0x0;
        }
      }
      else {
        if (puVar9 == (uint *)0x0) goto LAB_001094d0;
        *ret = *(Task **)(puVar9 + 2);
        LOCK();
        bVar10 = tVar2 == (this->head_)._M_i;
        if (bVar10) {
          (this->head_)._M_i =
               (tagged_index)((uVar3 & 0xffff) + ((uint)tVar2 & 0xffff0000) + 0x10000);
        }
        UNLOCK();
        puVar7 = (uint *)(ulong)bVar10;
        if (bVar10) {
          pnVar5 = (this->pool).
                   super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                   .nodes_;
          tVar8 = (this->pool).pool_._M_i;
          do {
            *(index_t *)((long)&(pnVar5->next)._M_i.index + (ulong)(((uint)tVar2 & 0xffff) << 6)) =
                 tVar8.index;
            paVar1 = &(this->pool).pool_;
            LOCK();
            tVar4 = paVar1->_M_i;
            bVar10 = tVar8 == tVar4;
            if (bVar10) {
              paVar1->_M_i = (tagged_index)(((uint)tVar8 & 0xffff0000) + ((uint)tVar2 & 0xffff));
              tVar4 = tVar8;
            }
            tVar8 = tVar4;
            UNLOCK();
          } while (!bVar10);
          in_CL = 1;
        }
      }
    }
    if ((char)puVar7 != '\0') {
      return (bool)(in_CL & 1);
    }
  } while( true );
}

Assistant:

bool pop (U & ret)
    {
        for (;;) {
            tagged_node_handle head = head_.load(memory_order_acquire);
            node * head_ptr = pool.get_pointer(head);

            tagged_node_handle tail = tail_.load(memory_order_acquire);
            tagged_node_handle next = head_ptr->next.load(memory_order_acquire);
            node * next_ptr = pool.get_pointer(next);

            tagged_node_handle head2 = head_.load(memory_order_acquire);
            if (BOOST_LIKELY(head == head2)) {
                if (pool.get_handle(head) == pool.get_handle(tail)) {
                    if (next_ptr == 0)
                        return false;

                    tagged_node_handle new_tail(pool.get_handle(next), tail.get_next_tag());
                    tail_.compare_exchange_strong(tail, new_tail);

                } else {
                    if (next_ptr == 0)
                        /* this check is not part of the original algorithm as published by michael and scott
                         *
                         * however we reuse the tagged_ptr part for the freelist and clear the next part during node
                         * allocation. we can observe a null-pointer here.
                         * */
                        continue;
                    detail::copy_payload(next_ptr->data, ret);

                    tagged_node_handle new_head(pool.get_handle(next), head.get_next_tag());
                    if (head_.compare_exchange_weak(head, new_head)) {
                        pool.template destruct<true>(head);
                        return true;
                    }
                }
            }
        }
    }